

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.hpp
# Opt level: O1

void __thiscall Storage::Disk::Drive::step(Drive *this,HeadPosition offset)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  int iVar5;
  Observer *pOVar6;
  
  if (offset.position_ == 0) {
    return;
  }
  if (((this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && (this->ready_type_ == IBMRDY)) {
    this->is_ready_ = true;
  }
  iVar2 = (this->head_position_).position_;
  iVar5 = offset.position_ + iVar2;
  (this->head_position_).position_ = iVar5;
  if (iVar5 < 0) {
    (this->head_position_).position_ = 0;
    pOVar6 = this->observer_;
    if (pOVar6 == (Observer *)0x0) goto LAB_00441b38;
    pp_Var3 = pOVar6->_vptr_Observer;
    uVar4 = 1;
  }
  else {
    pOVar6 = this->observer_;
    if (pOVar6 == (Observer *)0x0) goto LAB_00441b38;
    pp_Var3 = pOVar6->_vptr_Observer;
    uVar4 = 0;
  }
  (*pp_Var3[5])(pOVar6,&this->drive_name_,uVar4);
LAB_00441b38:
  peVar1 = (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_Disk[8])
                      (peVar1,CONCAT44((this->head_position_).position_,this->head_),
                       CONCAT44(iVar2,this->head_));
    if ((char)iVar2 != '\0') {
      this_00 = (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  (*(this->super_Source)._vptr_Source[3])(this,(ulong)(uint)(this->head_position_).position_);
  return;
}

Assistant:

constexpr bool operator ==(const HeadPosition &rhs) const {
			return position_ == rhs.position_;
		}